

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::WriteMatrix(ChSystemDescriptor *this,string *path,string *prefix)

{
  ChVectorDynamic<double> rhs;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_6d0;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  ChSparseMatrix Z;
  ChStreamOutAsciiFile file_rhs;
  ChStreamOutAsciiFile file_Z;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&Z);
  rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*this->_vptr_ChSystemDescriptor[0x1c])(this,&Z);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6d0,
                 path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_rhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6d0,
                 prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_Z,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_rhs,
                 "_Z.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_Z);
  std::__cxx11::string::~string((string *)&file_Z);
  std::__cxx11::string::~string((string *)&file_rhs);
  std::__cxx11::string::~string((string *)&local_6d0);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_Z,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_Z.super_ChStreamOutAscii,"%.12g");
  StreamOUTsparseMatlabFormat(&Z,&file_Z.super_ChStreamOutAscii);
  std::operator+(&local_670,path,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6d0,
                 &local_670,prefix);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file_rhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6d0,
                 "_rhs.dat");
  std::__cxx11::string::operator=((string *)&filename,(string *)&file_rhs);
  std::__cxx11::string::~string((string *)&file_rhs);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_670);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file_rhs,filename._M_dataplus._M_p,_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file_rhs.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_6d0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&rhs,(type *)0x0);
  StreamOUTdenseMatlabFormat(&local_6d0,&file_rhs.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free
            (local_6d0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_rhs);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file_Z);
  Eigen::internal::handmade_aligned_free
            (rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&Z);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void ChSystemDescriptor::WriteMatrix(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    ChSparseMatrix Z;
    ChVectorDynamic<double> rhs;
    ConvertToMatrixForm(&Z, &rhs);

    filename = path + "/" + prefix + "_Z.dat";
    ChStreamOutAsciiFile file_Z(filename.c_str());
    file_Z.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(Z, file_Z);

    filename = path + "/" + prefix + "_rhs.dat";
    ChStreamOutAsciiFile file_rhs(filename.c_str());
    file_rhs.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(rhs, file_rhs);
}